

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::createControlBarrier
          (Builder *this,Scope execution,Scope memory,MemorySemanticsMask semantics)

{
  Id IVar1;
  Instruction *pIVar2;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_30;
  Instruction *local_28;
  Instruction *op;
  Scope local_18;
  MemorySemanticsMask semantics_local;
  Scope memory_local;
  Scope execution_local;
  Builder *this_local;
  
  op._4_4_ = semantics;
  local_18 = memory;
  semantics_local = execution;
  _memory_local = this;
  pIVar2 = (Instruction *)::operator_new(0x60);
  spv::Instruction::Instruction(pIVar2,OpControlBarrier);
  local_28 = pIVar2;
  spv::Instruction::reserveOperands(pIVar2,3);
  pIVar2 = local_28;
  IVar1 = makeUintConstant(this,semantics_local,false);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  pIVar2 = local_28;
  IVar1 = makeUintConstant(this,local_18,false);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  pIVar2 = local_28;
  IVar1 = makeUintConstant(this,op._4_4_,false);
  spv::Instruction::addIdOperand(pIVar2,IVar1);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_30,
             local_28);
  addInstruction(this,&local_30);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_30);
  return;
}

Assistant:

void Builder::createControlBarrier(Scope execution, Scope memory, MemorySemanticsMask semantics)
{
    Instruction* op = new Instruction(OpControlBarrier);
    op->reserveOperands(3);
    op->addIdOperand(makeUintConstant(execution));
    op->addIdOperand(makeUintConstant(memory));
    op->addIdOperand(makeUintConstant(semantics));
    addInstruction(std::unique_ptr<Instruction>(op));
}